

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteUInt32
               (int field_number,uint32 value,CodedOutputStream *output)

{
  uint32 value_00;
  CodedOutputStream *output_local;
  uint32 value_local;
  int field_number_local;
  
  value_00 = MakeTag(field_number,WIRETYPE_VARINT);
  io::CodedOutputStream::WriteTag(output,value_00);
  io::CodedOutputStream::WriteVarint32(output,value);
  return;
}

Assistant:

void WireFormatLite::WriteUInt32(int field_number, uint32 value,
                                 io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_VARINT, output);
  WriteUInt32NoTag(value, output);
}